

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_piece_util_test.cc
# Opt level: O0

void __thiscall StringPieceUtilTestSplitStringPiece::Run(StringPieceUtilTestSplitStringPiece *this)

{
  Test *pTVar1;
  bool bVar2;
  size_type sVar3;
  reference pvVar4;
  StringPiece local_270;
  StringPiece local_260;
  StringPiece local_250;
  StringPiece local_240;
  StringPiece local_230;
  StringPiece local_220;
  undefined1 local_210 [8];
  vector<StringPiece,_std::allocator<StringPiece>_> list_4;
  undefined1 local_1f0 [8];
  string sep;
  StringPiece local_1c0;
  StringPiece local_1b0;
  undefined1 local_1a0 [8];
  vector<StringPiece,_std::allocator<StringPiece>_> list_3;
  undefined1 local_180 [8];
  string sep_only;
  StringPiece local_150;
  undefined1 local_140 [8];
  vector<StringPiece,_std::allocator<StringPiece>_> list_2;
  undefined1 local_120 [8];
  string one;
  StringPiece local_f0;
  undefined1 local_e0 [8];
  vector<StringPiece,_std::allocator<StringPiece>_> list_1;
  undefined1 local_c0 [8];
  string empty;
  StringPiece local_90;
  StringPiece local_80;
  StringPiece local_70;
  undefined1 local_60 [8];
  vector<StringPiece,_std::allocator<StringPiece>_> list;
  allocator<char> local_31;
  undefined1 local_30 [8];
  string input;
  StringPieceUtilTestSplitStringPiece *this_local;
  
  input.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_30,"a:b:c",&local_31);
  std::allocator<char>::~allocator(&local_31);
  StringPiece::StringPiece(&local_70,(string *)local_30);
  SplitStringPiece((vector<StringPiece,_std::allocator<StringPiece>_> *)local_60,local_70,':');
  pTVar1 = g_current_test;
  sVar3 = std::vector<StringPiece,_std::allocator<StringPiece>_>::size
                    ((vector<StringPiece,_std::allocator<StringPiece>_> *)local_60);
  testing::Test::Check
            (pTVar1,sVar3 == 3,
             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/string_piece_util_test.cc"
             ,0x1a,"list.size() == 3");
  pTVar1 = g_current_test;
  pvVar4 = std::vector<StringPiece,_std::allocator<StringPiece>_>::operator[]
                     ((vector<StringPiece,_std::allocator<StringPiece>_> *)local_60,0);
  StringPiece::StringPiece(&local_80,"a");
  bVar2 = StringPiece::operator==(pvVar4,&local_80);
  testing::Test::Check
            (pTVar1,bVar2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/string_piece_util_test.cc"
             ,0x1c,"list[0] == \"a\"");
  pTVar1 = g_current_test;
  pvVar4 = std::vector<StringPiece,_std::allocator<StringPiece>_>::operator[]
                     ((vector<StringPiece,_std::allocator<StringPiece>_> *)local_60,1);
  StringPiece::StringPiece(&local_90,"b");
  bVar2 = StringPiece::operator==(pvVar4,&local_90);
  testing::Test::Check
            (pTVar1,bVar2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/string_piece_util_test.cc"
             ,0x1d,"list[1] == \"b\"");
  pTVar1 = g_current_test;
  pvVar4 = std::vector<StringPiece,_std::allocator<StringPiece>_>::operator[]
                     ((vector<StringPiece,_std::allocator<StringPiece>_> *)local_60,2);
  StringPiece::StringPiece((StringPiece *)((long)&empty.field_2 + 8),"c");
  bVar2 = StringPiece::operator==(pvVar4,(StringPiece *)((long)&empty.field_2 + 8));
  testing::Test::Check
            (pTVar1,bVar2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/string_piece_util_test.cc"
             ,0x1e,"list[2] == \"c\"");
  std::vector<StringPiece,_std::allocator<StringPiece>_>::~vector
            ((vector<StringPiece,_std::allocator<StringPiece>_> *)local_60);
  std::__cxx11::string::~string((string *)local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_c0,"",
             (allocator<char> *)
             ((long)&list_1.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&list_1.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  StringPiece::StringPiece(&local_f0,(string *)local_c0);
  SplitStringPiece((vector<StringPiece,_std::allocator<StringPiece>_> *)local_e0,local_f0,':');
  pTVar1 = g_current_test;
  sVar3 = std::vector<StringPiece,_std::allocator<StringPiece>_>::size
                    ((vector<StringPiece,_std::allocator<StringPiece>_> *)local_e0);
  testing::Test::Check
            (pTVar1,sVar3 == 1,
             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/string_piece_util_test.cc"
             ,0x25,"list.size() == 1");
  pTVar1 = g_current_test;
  pvVar4 = std::vector<StringPiece,_std::allocator<StringPiece>_>::operator[]
                     ((vector<StringPiece,_std::allocator<StringPiece>_> *)local_e0,0);
  StringPiece::StringPiece((StringPiece *)((long)&one.field_2 + 8),"");
  bVar2 = StringPiece::operator==(pvVar4,(StringPiece *)((long)&one.field_2 + 8));
  testing::Test::Check
            (pTVar1,bVar2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/string_piece_util_test.cc"
             ,0x27,"list[0] == \"\"");
  std::vector<StringPiece,_std::allocator<StringPiece>_>::~vector
            ((vector<StringPiece,_std::allocator<StringPiece>_> *)local_e0);
  std::__cxx11::string::~string((string *)local_c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_120,"a",
             (allocator<char> *)
             ((long)&list_2.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&list_2.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  StringPiece::StringPiece(&local_150,(string *)local_120);
  SplitStringPiece((vector<StringPiece,_std::allocator<StringPiece>_> *)local_140,local_150,':');
  pTVar1 = g_current_test;
  sVar3 = std::vector<StringPiece,_std::allocator<StringPiece>_>::size
                    ((vector<StringPiece,_std::allocator<StringPiece>_> *)local_140);
  testing::Test::Check
            (pTVar1,sVar3 == 1,
             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/string_piece_util_test.cc"
             ,0x2e,"list.size() == 1");
  pTVar1 = g_current_test;
  pvVar4 = std::vector<StringPiece,_std::allocator<StringPiece>_>::operator[]
                     ((vector<StringPiece,_std::allocator<StringPiece>_> *)local_140,0);
  StringPiece::StringPiece((StringPiece *)((long)&sep_only.field_2 + 8),"a");
  bVar2 = StringPiece::operator==(pvVar4,(StringPiece *)((long)&sep_only.field_2 + 8));
  testing::Test::Check
            (pTVar1,bVar2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/string_piece_util_test.cc"
             ,0x30,"list[0] == \"a\"");
  std::vector<StringPiece,_std::allocator<StringPiece>_>::~vector
            ((vector<StringPiece,_std::allocator<StringPiece>_> *)local_140);
  std::__cxx11::string::~string((string *)local_120);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_180,":",
             (allocator<char> *)
             ((long)&list_3.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&list_3.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  StringPiece::StringPiece(&local_1b0,(string *)local_180);
  SplitStringPiece((vector<StringPiece,_std::allocator<StringPiece>_> *)local_1a0,local_1b0,':');
  pTVar1 = g_current_test;
  sVar3 = std::vector<StringPiece,_std::allocator<StringPiece>_>::size
                    ((vector<StringPiece,_std::allocator<StringPiece>_> *)local_1a0);
  testing::Test::Check
            (pTVar1,sVar3 == 2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/string_piece_util_test.cc"
             ,0x37,"list.size() == 2");
  pTVar1 = g_current_test;
  pvVar4 = std::vector<StringPiece,_std::allocator<StringPiece>_>::operator[]
                     ((vector<StringPiece,_std::allocator<StringPiece>_> *)local_1a0,0);
  StringPiece::StringPiece(&local_1c0,"");
  bVar2 = StringPiece::operator==(pvVar4,&local_1c0);
  testing::Test::Check
            (pTVar1,bVar2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/string_piece_util_test.cc"
             ,0x39,"list[0] == \"\"");
  pTVar1 = g_current_test;
  pvVar4 = std::vector<StringPiece,_std::allocator<StringPiece>_>::operator[]
                     ((vector<StringPiece,_std::allocator<StringPiece>_> *)local_1a0,1);
  StringPiece::StringPiece((StringPiece *)((long)&sep.field_2 + 8),"");
  bVar2 = StringPiece::operator==(pvVar4,(StringPiece *)((long)&sep.field_2 + 8));
  testing::Test::Check
            (pTVar1,bVar2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/string_piece_util_test.cc"
             ,0x3a,"list[1] == \"\"");
  std::vector<StringPiece,_std::allocator<StringPiece>_>::~vector
            ((vector<StringPiece,_std::allocator<StringPiece>_> *)local_1a0);
  std::__cxx11::string::~string((string *)local_180);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1f0,":a:b:c:",
             (allocator<char> *)
             ((long)&list_4.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&list_4.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  StringPiece::StringPiece(&local_220,(string *)local_1f0);
  SplitStringPiece((vector<StringPiece,_std::allocator<StringPiece>_> *)local_210,local_220,':');
  pTVar1 = g_current_test;
  sVar3 = std::vector<StringPiece,_std::allocator<StringPiece>_>::size
                    ((vector<StringPiece,_std::allocator<StringPiece>_> *)local_210);
  testing::Test::Check
            (pTVar1,sVar3 == 5,
             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/string_piece_util_test.cc"
             ,0x41,"list.size() == 5");
  pTVar1 = g_current_test;
  pvVar4 = std::vector<StringPiece,_std::allocator<StringPiece>_>::operator[]
                     ((vector<StringPiece,_std::allocator<StringPiece>_> *)local_210,0);
  StringPiece::StringPiece(&local_230,"");
  bVar2 = StringPiece::operator==(pvVar4,&local_230);
  testing::Test::Check
            (pTVar1,bVar2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/string_piece_util_test.cc"
             ,0x43,"list[0] == \"\"");
  pTVar1 = g_current_test;
  pvVar4 = std::vector<StringPiece,_std::allocator<StringPiece>_>::operator[]
                     ((vector<StringPiece,_std::allocator<StringPiece>_> *)local_210,1);
  StringPiece::StringPiece(&local_240,"a");
  bVar2 = StringPiece::operator==(pvVar4,&local_240);
  testing::Test::Check
            (pTVar1,bVar2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/string_piece_util_test.cc"
             ,0x44,"list[1] == \"a\"");
  pTVar1 = g_current_test;
  pvVar4 = std::vector<StringPiece,_std::allocator<StringPiece>_>::operator[]
                     ((vector<StringPiece,_std::allocator<StringPiece>_> *)local_210,2);
  StringPiece::StringPiece(&local_250,"b");
  bVar2 = StringPiece::operator==(pvVar4,&local_250);
  testing::Test::Check
            (pTVar1,bVar2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/string_piece_util_test.cc"
             ,0x45,"list[2] == \"b\"");
  pTVar1 = g_current_test;
  pvVar4 = std::vector<StringPiece,_std::allocator<StringPiece>_>::operator[]
                     ((vector<StringPiece,_std::allocator<StringPiece>_> *)local_210,3);
  StringPiece::StringPiece(&local_260,"c");
  bVar2 = StringPiece::operator==(pvVar4,&local_260);
  testing::Test::Check
            (pTVar1,bVar2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/string_piece_util_test.cc"
             ,0x46,"list[3] == \"c\"");
  pTVar1 = g_current_test;
  pvVar4 = std::vector<StringPiece,_std::allocator<StringPiece>_>::operator[]
                     ((vector<StringPiece,_std::allocator<StringPiece>_> *)local_210,4);
  StringPiece::StringPiece(&local_270,"");
  bVar2 = StringPiece::operator==(pvVar4,&local_270);
  testing::Test::Check
            (pTVar1,bVar2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/string_piece_util_test.cc"
             ,0x47,"list[4] == \"\"");
  std::vector<StringPiece,_std::allocator<StringPiece>_>::~vector
            ((vector<StringPiece,_std::allocator<StringPiece>_> *)local_210);
  std::__cxx11::string::~string((string *)local_1f0);
  return;
}

Assistant:

TEST(StringPieceUtilTest, SplitStringPiece) {
  {
    string input("a:b:c");
    vector<StringPiece> list = SplitStringPiece(input, ':');

    EXPECT_EQ(list.size(), 3);

    EXPECT_EQ(list[0], "a");
    EXPECT_EQ(list[1], "b");
    EXPECT_EQ(list[2], "c");
  }

  {
    string empty("");
    vector<StringPiece> list = SplitStringPiece(empty, ':');

    EXPECT_EQ(list.size(), 1);

    EXPECT_EQ(list[0], "");
  }

  {
    string one("a");
    vector<StringPiece> list = SplitStringPiece(one, ':');

    EXPECT_EQ(list.size(), 1);

    EXPECT_EQ(list[0], "a");
  }

  {
    string sep_only(":");
    vector<StringPiece> list = SplitStringPiece(sep_only, ':');

    EXPECT_EQ(list.size(), 2);

    EXPECT_EQ(list[0], "");
    EXPECT_EQ(list[1], "");
  }

  {
    string sep(":a:b:c:");
    vector<StringPiece> list = SplitStringPiece(sep, ':');

    EXPECT_EQ(list.size(), 5);

    EXPECT_EQ(list[0], "");
    EXPECT_EQ(list[1], "a");
    EXPECT_EQ(list[2], "b");
    EXPECT_EQ(list[3], "c");
    EXPECT_EQ(list[4], "");
  }
}